

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O1

void __thiscall StatusPrinter::StatusPrinter(StatusPrinter *this,BuildConfig *config)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  (this->super_Status)._vptr_Status = (_func_int **)&PTR_PlanHasTotalEdges_00136bf0;
  this->config_ = config;
  this->started_edges_ = 0;
  this->finished_edges_ = 0;
  this->total_edges_ = 0;
  this->running_edges_ = 0;
  this->time_millis_ = 0;
  LinePrinter::LinePrinter(&this->printer_);
  this->progress_status_format_ = (char *)0x0;
  iVar1 = *(int *)(config + 8);
  (this->current_rate_).rate_ = -1.0;
  (this->current_rate_).N = (long)iVar1;
  (this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->current_rate_).times_.c.super__Deque_base<double,_std::allocator<double>_>._M_impl
           .super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map
            ((_Deque_base<double,_std::allocator<double>_> *)&(this->current_rate_).times_,0);
  (this->current_rate_).last_update_ = -1;
  if (*(int *)this->config_ != 2) {
    (this->printer_).smart_terminal_ = false;
  }
  pcVar2 = getenv("NINJA_STATUS");
  pcVar3 = "[%f/%t] ";
  if (pcVar2 != (char *)0x0) {
    pcVar3 = pcVar2;
  }
  this->progress_status_format_ = pcVar3;
  return;
}

Assistant:

StatusPrinter::StatusPrinter(const BuildConfig& config)
    : config_(config),
      started_edges_(0), finished_edges_(0), total_edges_(0), running_edges_(0),
      time_millis_(0), progress_status_format_(NULL),
      current_rate_(config.parallelism) {

  // Don't do anything fancy in verbose mode.
  if (config_.verbosity != BuildConfig::NORMAL)
    printer_.set_smart_terminal(false);

  progress_status_format_ = getenv("NINJA_STATUS");
  if (!progress_status_format_)
    progress_status_format_ = "[%f/%t] ";
}